

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
libtorrent::aux::session_settings_single_thread::
get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>
          (session_settings_single_thread *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
          *c,int name,int type)

{
  int iVar1;
  size_t index;
  int type_local;
  int name_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
  *c_local;
  session_settings_single_thread *this_local;
  
  if (get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
      ::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
                                 ::empty_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::string::string
                ((string *)
                 &get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
                  ::empty_abi_cxx11_);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
                    ::empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
                           ::empty_abi_cxx11_);
    }
  }
  if ((name & 0xc000U) == type) {
    this_local = (session_settings_single_thread *)
                 ::std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                 ::operator[](c,(long)(int)(name & 0x3fff));
  }
  else {
    this_local = (session_settings_single_thread *)
                 &get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
                  ::empty_abi_cxx11_;
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
}

Assistant:

T get(Container const& c, int const name, int const type) const
		{
			static typename std::remove_reference<T>::type empty;
			TORRENT_ASSERT((name & settings_pack::type_mask) == type);
			if ((name & settings_pack::type_mask) != type) return empty;
			size_t const index = name & settings_pack::index_mask;
			TORRENT_ASSERT(index < c.size());
			return c[index];
		}